

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall
pbrt::PathIntegrator::PathIntegrator
          (PathIntegrator *this,int maxDepth,Camera *camera,Sampler *sampler,Primitive *aggregate,
          vector<pbrt::Light,_std::allocator<pbrt::Light>_> *lights,string *lightSampleStrategy,
          bool regularize)

{
  span<const_pbrt::Light> lights_00;
  string *in_RCX;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  Allocator in_R8;
  Light *in_R9;
  polymorphic_allocator<std::byte> *in_stack_00000008;
  byte in_stack_00000010;
  Sampler *in_stack_ffffffffffffff18;
  Sampler *in_stack_ffffffffffffff20;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff70;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  Sampler *in_stack_ffffffffffffffa0;
  Camera *in_stack_ffffffffffffffa8;
  RayIntegrator *in_stack_ffffffffffffffb0;
  
  Camera::Camera((Camera *)in_stack_ffffffffffffff20,(Camera *)in_stack_ffffffffffffff18);
  Sampler::Sampler(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Primitive::Primitive
            ((Primitive *)in_stack_ffffffffffffff20,(Primitive *)in_stack_ffffffffffffff18);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::vector
            (in_stack_ffffffffffffff70,
             (vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)&stack0xffffffffffffff98);
  RayIntegrator::RayIntegrator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (Primitive *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::~vector
            ((vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)in_RCX);
  *in_RDI = &PTR__PathIntegrator_036c5190;
  *(undefined4 *)(in_RDI + 10) = in_ESI;
  pstd::span<const_pbrt::Light>::span<pbrt::Light>((span<const_pbrt::Light> *)in_RCX,in_RDX);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(in_stack_00000008);
  lights_00.n = (size_t)in_RDI;
  lights_00.ptr = in_R9;
  LightSampler::Create(in_RCX,lights_00,in_R8);
  *(byte *)(in_RDI + 0xc) = in_stack_00000010 & 1;
  return;
}

Assistant:

PathIntegrator::PathIntegrator(int maxDepth, Camera camera, Sampler sampler,
                               Primitive aggregate, std::vector<Light> lights,
                               const std::string &lightSampleStrategy, bool regularize)
    : RayIntegrator(camera, sampler, aggregate, lights),
      maxDepth(maxDepth),
      lightSampler(LightSampler::Create(lightSampleStrategy, lights, Allocator())),
      regularize(regularize) {}